

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

bool __thiscall FOptionMenuItemControl::Activate(FOptionMenuItemControl *this)

{
  DEnterKey *this_00;
  FSoundID local_14;
  
  S_FindSound("menu/choose");
  S_Sound(0x22,&local_14,snd_menuvolume.Value,0.0);
  this->mWaiting = true;
  this_00 = (DEnterKey *)DObject::operator_new(0x38);
  DEnterKey::DEnterKey(this_00,DMenu::CurrentMenu,&this->mInput);
  M_ActivateMenu((DMenu *)this_00);
  return true;
}

Assistant:

bool Activate()
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
		mWaiting = true;
		DMenu *input = new DEnterKey(DMenu::CurrentMenu, &mInput);
		M_ActivateMenu(input);
		return true;
	}